

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int i2c_read_i2c_block_data(int pi,uint handle,uint reg,char *buf,uint32_t count)

{
  int iVar1;
  undefined4 in_EDX;
  int in_ESI;
  gpioExtent_t ext [1];
  int bytes;
  int in_stack_00000fc0;
  int in_stack_00000fc4;
  void *in_stack_00000fc8;
  int in_stack_00000fd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  undefined1 local_1c [12];
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = pigpio_command_ext(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                             in_stack_ffffffffffffffd8,(int)((ulong)local_1c >> 0x20),(int)local_1c,
                             0,(gpioExtent_t *)CONCAT44(in_EDX,in_stack_fffffffffffffff0),in_ESI);
  if (0 < iVar1) {
    iVar1 = recvMax(in_stack_00000fd4,in_stack_00000fc8,in_stack_00000fc4,in_stack_00000fc0);
  }
  _pmu(0);
  return iVar1;
}

Assistant:

int i2c_read_i2c_block_data(
   int pi, unsigned handle, unsigned reg, char *buf, uint32_t count)
{
   int bytes;
   gpioExtent_t ext[1];

   /*
   p1=handle
   p2=reg
   p3=4
   ## extension ##
   uint32_t count
   */

   ext[0].size = sizeof(uint32_t);
   ext[0].ptr = &count;

   bytes = pigpio_command_ext
      (pi, PI_CMD_I2CRI, handle, reg, 4, 1, ext, 0);

   if (bytes > 0)
   {
      bytes = recvMax(pi, buf, count, bytes);
   }

   _pmu(pi);

   return bytes;
}